

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

uint32_t hydro_random_uniform(uint32_t upper_bound)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (1 < upper_bound) {
    do {
      uVar1 = hydro_random_u32();
    } while (uVar1 < -upper_bound % upper_bound);
    uVar2 = uVar1 % upper_bound;
  }
  return uVar2;
}

Assistant:

uint32_t
hydro_random_uniform(const uint32_t upper_bound)
{
    uint32_t min;
    uint32_t r;

    if (upper_bound < 2U) {
        return 0;
    }
    min = (1U + ~upper_bound) % upper_bound; /* = 2**32 mod upper_bound */
    do {
        r = hydro_random_u32();
    } while (r < min);
    /* r is now clamped to a set whose size mod upper_bound == 0
     * the worst case (2**31+1) requires 2 attempts on average */

    return r % upper_bound;
}